

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void FTransformPass1_SSE2(__m128i *in01,__m128i *in23,__m128i *out01,__m128i *out32)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 (*in_RCX) [16];
  undefined4 *in_RDX;
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  __m128i tmp1_2;
  __m128i tmp3_1;
  __m128i tmp1_1;
  __m128i tmp2;
  __m128i tmp0;
  __m128i a32;
  __m128i a01;
  __m128i s32;
  __m128i s01;
  __m128i shuf23_p;
  __m128i shuf01_p;
  __m128i k5352_2217m;
  __m128i k5352_2217p;
  __m128i k88m;
  __m128i k88p;
  __m128i k1812;
  __m128i k937;
  undefined8 local_3d8;
  int local_268;
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  short sStack_21a;
  undefined2 local_1f8;
  undefined2 uStack_1f6;
  undefined2 uStack_1f4;
  undefined2 uStack_1f2;
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  undefined2 uStack_1d0;
  undefined2 uStack_1ce;
  undefined2 uStack_1cc;
  undefined2 uStack_1ca;
  undefined2 uStack_1c0;
  undefined2 uStack_1be;
  undefined2 uStack_1bc;
  undefined2 uStack_1ba;
  undefined4 uStack_130;
  undefined4 uStack_120;
  undefined4 uStack_114;
  undefined4 uStack_104;
  undefined4 uStack_ec;
  undefined4 uStack_dc;
  __m128i v23;
  __m128i s_hi;
  __m128i s_lo;
  __m128i s12;
  __m128i s03;
  __m128i tmp3;
  __m128i tmp1;
  __m128i tmp3_2;
  
  auVar9 = pshufhw(*in_RDI,*in_RDI,0xb1);
  auVar10 = pshufhw(*in_RSI,*in_RSI,0xb1);
  local_228 = (short)uStack_130;
  sStack_226 = (short)((uint)uStack_130 >> 0x10);
  sStack_224 = auVar10._12_2_;
  sStack_222 = auVar10._14_2_;
  sStack_220 = auVar10._0_2_;
  sStack_21e = auVar10._2_2_;
  sStack_21c = auVar10._4_2_;
  sStack_21a = auVar10._6_2_;
  local_238 = (short)local_3d8;
  sStack_236 = (short)((ulong)local_3d8 >> 0x10);
  sStack_234 = (short)((ulong)local_3d8 >> 0x20);
  sStack_232 = (short)((ulong)local_3d8 >> 0x30);
  sStack_230 = (short)uStack_120;
  sStack_22e = (short)((uint)uStack_120 >> 0x10);
  sStack_22c = auVar9._12_2_;
  sStack_22a = auVar9._14_2_;
  auVar8._2_2_ = sStack_226 + sStack_236;
  auVar8._0_2_ = local_228 + local_238;
  auVar8._4_2_ = sStack_224 + sStack_234;
  auVar8._6_2_ = sStack_222 + sStack_232;
  auVar8._10_2_ = sStack_21e + sStack_22e;
  auVar8._8_2_ = sStack_220 + sStack_230;
  auVar8._12_2_ = sStack_21c + sStack_22c;
  auVar8._14_2_ = sStack_21a + sStack_22a;
  auVar7._8_8_ = 0x8000800080008;
  auVar7._0_8_ = 0x8000800080008;
  auVar9 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = sStack_226 + sStack_236;
  auVar6._0_2_ = local_228 + local_238;
  auVar6._4_2_ = sStack_224 + sStack_234;
  auVar6._6_2_ = sStack_222 + sStack_232;
  auVar6._10_2_ = sStack_21e + sStack_22e;
  auVar6._8_2_ = sStack_220 + sStack_230;
  auVar6._12_2_ = sStack_21c + sStack_22c;
  auVar6._14_2_ = sStack_21a + sStack_22a;
  auVar5._8_8_ = 0xfff80008fff80008;
  auVar5._0_8_ = 0xfff80008fff80008;
  auVar10 = pmaddwd(auVar6,auVar5);
  auVar4._2_2_ = sStack_226 - sStack_236;
  auVar4._0_2_ = local_228 - local_238;
  auVar4._4_2_ = sStack_224 - sStack_234;
  auVar4._6_2_ = sStack_222 - sStack_232;
  auVar4._10_2_ = sStack_21e - sStack_22e;
  auVar4._8_2_ = sStack_220 - sStack_230;
  auVar4._12_2_ = sStack_21c - sStack_22c;
  auVar4._14_2_ = sStack_21a - sStack_22a;
  auVar3._8_8_ = 0x8a914e808a914e8;
  auVar3._0_8_ = 0x8a914e808a914e8;
  auVar11 = pmaddwd(auVar4,auVar3);
  auVar14._2_2_ = sStack_226 - sStack_236;
  auVar14._0_2_ = local_228 - local_238;
  auVar14._4_2_ = sStack_224 - sStack_234;
  auVar14._6_2_ = sStack_222 - sStack_232;
  auVar14._10_2_ = sStack_21e - sStack_22e;
  auVar14._8_2_ = sStack_220 - sStack_230;
  auVar14._12_2_ = sStack_21c - sStack_22c;
  auVar14._14_2_ = sStack_21a - sStack_22a;
  auVar12._8_8_ = 0xeb1808a9eb1808a9;
  auVar12._0_8_ = 0xeb1808a9eb1808a9;
  auVar12 = pmaddwd(auVar14,auVar12);
  local_248 = auVar11._0_4_;
  iStack_244 = auVar11._4_4_;
  iStack_240 = auVar11._8_4_;
  iStack_23c = auVar11._12_4_;
  local_268 = auVar12._0_4_;
  iStack_264 = auVar12._4_4_;
  iStack_260 = auVar12._8_4_;
  iStack_25c = auVar12._12_4_;
  auVar12 = ZEXT416(9);
  auVar14 = ZEXT416(9);
  auVar9 = packssdw(auVar9,auVar10);
  auVar11._4_4_ = iStack_244 + 0x714 >> auVar12;
  auVar11._0_4_ = local_248 + 0x714 >> auVar12;
  auVar11._12_4_ = iStack_23c + 0x714 >> auVar12;
  auVar11._8_4_ = iStack_240 + 0x714 >> auVar12;
  auVar10._4_4_ = iStack_264 + 0x3a9 >> auVar14;
  auVar10._0_4_ = local_268 + 0x3a9 >> auVar14;
  auVar10._12_4_ = iStack_25c + 0x3a9 >> auVar14;
  auVar10._8_4_ = iStack_260 + 0x3a9 >> auVar14;
  auVar10 = packssdw(auVar11,auVar10);
  local_1e8 = auVar9._0_2_;
  uStack_1e6 = auVar9._2_2_;
  uStack_1e4 = auVar9._4_2_;
  uStack_1e2 = auVar9._6_2_;
  local_1f8 = auVar10._0_2_;
  uStack_1f6 = auVar10._2_2_;
  uStack_1f4 = auVar10._4_2_;
  uStack_1f2 = auVar10._6_2_;
  uStack_1c0 = auVar9._8_2_;
  uStack_1be = auVar9._10_2_;
  uStack_1bc = auVar9._12_2_;
  uStack_1ba = auVar9._14_2_;
  uStack_1d0 = auVar10._8_2_;
  uStack_1ce = auVar10._10_2_;
  uStack_1cc = auVar10._12_2_;
  uStack_1ca = auVar10._14_2_;
  uVar2 = CONCAT22(uStack_1f4,uStack_1e4);
  uVar1 = CONCAT22(uStack_1cc,uStack_1bc);
  uStack_dc = (undefined4)(CONCAT26(uStack_1f2,CONCAT24(uStack_1e2,uVar2)) >> 0x20);
  uStack_ec = (undefined4)(CONCAT26(uStack_1ca,CONCAT24(uStack_1ba,uVar1)) >> 0x20);
  uStack_104 = (undefined4)
               (CONCAT26(uStack_1f6,CONCAT24(uStack_1e6,CONCAT22(local_1f8,local_1e8))) >> 0x20);
  uStack_114 = (undefined4)
               (CONCAT26(uStack_1ce,CONCAT24(uStack_1be,CONCAT22(uStack_1d0,uStack_1c0))) >> 0x20);
  *in_RDX = CONCAT22(local_1f8,local_1e8);
  in_RDX[1] = CONCAT22(uStack_1d0,uStack_1c0);
  in_RDX[2] = uStack_104;
  in_RDX[3] = uStack_114;
  auVar9._4_4_ = uVar1;
  auVar9._0_4_ = uVar2;
  auVar9._8_4_ = uStack_dc;
  auVar9._12_4_ = uStack_ec;
  auVar13._0_8_ = auVar9._8_8_;
  auVar13._8_4_ = uVar2;
  auVar13._12_4_ = uVar1;
  *in_RCX = auVar13;
  return;
}

Assistant:

static void FTransformPass1_SSE2(const __m128i* const in01,
                                 const __m128i* const in23,
                                 __m128i* const out01,
                                 __m128i* const out32) {
  const __m128i k937 = _mm_set1_epi32(937);
  const __m128i k1812 = _mm_set1_epi32(1812);

  const __m128i k88p = _mm_set_epi16(8, 8, 8, 8, 8, 8, 8, 8);
  const __m128i k88m = _mm_set_epi16(-8, 8, -8, 8, -8, 8, -8, 8);
  const __m128i k5352_2217p = _mm_set_epi16(2217, 5352, 2217, 5352,
                                            2217, 5352, 2217, 5352);
  const __m128i k5352_2217m = _mm_set_epi16(-5352, 2217, -5352, 2217,
                                            -5352, 2217, -5352, 2217);

  // *in01 = 00 01 10 11 02 03 12 13
  // *in23 = 20 21 30 31 22 23 32 33
  const __m128i shuf01_p = _mm_shufflehi_epi16(*in01, _MM_SHUFFLE(2, 3, 0, 1));
  const __m128i shuf23_p = _mm_shufflehi_epi16(*in23, _MM_SHUFFLE(2, 3, 0, 1));
  // 00 01 10 11 03 02 13 12
  // 20 21 30 31 23 22 33 32
  const __m128i s01 = _mm_unpacklo_epi64(shuf01_p, shuf23_p);
  const __m128i s32 = _mm_unpackhi_epi64(shuf01_p, shuf23_p);
  // 00 01 10 11 20 21 30 31
  // 03 02 13 12 23 22 33 32
  const __m128i a01 = _mm_add_epi16(s01, s32);
  const __m128i a32 = _mm_sub_epi16(s01, s32);
  // [d0 + d3 | d1 + d2 | ...] = [a0 a1 | a0' a1' | ... ]
  // [d0 - d3 | d1 - d2 | ...] = [a3 a2 | a3' a2' | ... ]

  const __m128i tmp0   = _mm_madd_epi16(a01, k88p);  // [ (a0 + a1) << 3, ... ]
  const __m128i tmp2   = _mm_madd_epi16(a01, k88m);  // [ (a0 - a1) << 3, ... ]
  const __m128i tmp1_1 = _mm_madd_epi16(a32, k5352_2217p);
  const __m128i tmp3_1 = _mm_madd_epi16(a32, k5352_2217m);
  const __m128i tmp1_2 = _mm_add_epi32(tmp1_1, k1812);
  const __m128i tmp3_2 = _mm_add_epi32(tmp3_1, k937);
  const __m128i tmp1   = _mm_srai_epi32(tmp1_2, 9);
  const __m128i tmp3   = _mm_srai_epi32(tmp3_2, 9);
  const __m128i s03    = _mm_packs_epi32(tmp0, tmp2);
  const __m128i s12    = _mm_packs_epi32(tmp1, tmp3);
  const __m128i s_lo   = _mm_unpacklo_epi16(s03, s12);   // 0 1 0 1 0 1...
  const __m128i s_hi   = _mm_unpackhi_epi16(s03, s12);   // 2 3 2 3 2 3
  const __m128i v23    = _mm_unpackhi_epi32(s_lo, s_hi);
  *out01 = _mm_unpacklo_epi32(s_lo, s_hi);
  *out32 = _mm_shuffle_epi32(v23, _MM_SHUFFLE(1, 0, 3, 2));  // 3 2 3 2 3 2..
}